

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

uintm __thiscall PcodeOp::getCseHash(PcodeOp *this)

{
  bool bVar1;
  uint4 uVar2;
  OpCode OVar3;
  int4 iVar4;
  size_type sVar5;
  Varnode *this_00;
  uintb uVar6;
  Varnode *vn;
  int4 i;
  uintm hash;
  PcodeOp *this_local;
  
  uVar2 = getEvalType(this);
  if ((uVar2 & 0x18000) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    OVar3 = code(this);
    if (OVar3 == CPUI_COPY) {
      this_local._4_4_ = 0;
    }
    else {
      iVar4 = Varnode::getSize(this->output);
      OVar3 = code(this);
      vn._4_4_ = iVar4 << 8 | OVar3;
      vn._0_4_ = 0;
      while( true ) {
        sVar5 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&this->inrefs);
        if (sVar5 <= (ulong)(long)(int)vn) break;
        this_00 = getIn(this,(int)vn);
        bVar1 = Varnode::isConstant(this_00);
        if (bVar1) {
          uVar6 = Varnode::getOffset(this_00);
          OVar3 = (OpCode)uVar6;
        }
        else {
          OVar3 = Varnode::getCreateIndex(this_00);
        }
        vn._4_4_ = OVar3 ^ (vn._4_4_ << 8 | vn._4_4_ >> 0x18);
        vn._0_4_ = (int)vn + 1;
      }
      this_local._4_4_ = vn._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

uintm PcodeOp::getCseHash(void) const

{
  uintm hash;
  if ((getEvalType()&(PcodeOp::unary|PcodeOp::binary))==0) return ((uintm)0);
  if (code()==CPUI_COPY) return ((uintm)0); // Let copy propagation deal with this
  
  hash = (output->getSize()<<8) | (uintm)code();
  for(int4 i=0;i<inrefs.size();++i) {
    const Varnode *vn = getIn(i);
    hash = (hash<<8) | (hash>>(sizeof(uintm)*8-8));
    if (vn->isConstant())
      hash ^= (uintm)vn->getOffset();
    else
      hash ^= (uintm)vn->getCreateIndex(); // Hash in pointer itself as unique id
  }
  return hash;
}